

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O1

matrix sptk::swipe::loudness(vector x,vector fERBs,double nyquist,int w,int w2)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *extraout_RDX_02;
  int i;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  undefined4 in_register_00000084;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector vVar23;
  matrix L;
  matrix mVar24;
  vector yr_vector;
  vector yr_vector_00;
  matrix L_00;
  vector f;
  vector f_00;
  vector f_01;
  vector fERBs_00;
  vector fERBs_01;
  vector fERBs_02;
  double **local_170;
  allocator_type local_151;
  ulong local_150;
  int local_144;
  double *local_140;
  double *local_138;
  long local_130;
  long local_128;
  ulong local_120;
  undefined8 local_118;
  uint local_10c;
  vector<double,_std::allocator<double>_> fi;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  fo;
  Buffer buffer;
  RealValuedFastFourierTransform plan;
  double *extraout_RDX;
  double *extraout_RDX_00;
  double *extraout_RDX_01;
  
  uVar13 = CONCAT44(in_register_00000084,w);
  local_140 = fERBs.v;
  local_138 = x.v;
  local_144 = x.x;
  std::vector<double,_std::allocator<double>_>::vector(&fi,(long)w,(allocator_type *)&plan);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&plan,(long)w,(allocator_type *)&buffer);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&fo,2,(value_type *)&plan,&local_151);
  if (plan._vptr_RealValuedFastFourierTransform != (_func_int **)0x0) {
    operator_delete(plan._vptr_RealValuedFastFourierTransform);
  }
  RealValuedFastFourierTransform::RealValuedFastFourierTransform(&plan,w2 * 2 + -1,w2 * 2);
  buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00135c68;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vVar23 = makev(w);
  pdVar7 = vVar23.v;
  local_10c = vVar23.x;
  uVar12 = (ulong)(uint)w;
  if (0 < w) {
    uVar10 = 0;
    do {
      dVar18 = cos(((double)(int)uVar10 / (double)w) * 6.283185307179586);
      pdVar7[uVar10] = dVar18 * -0.5 + 0.5;
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
  }
  vVar23 = makev(w2);
  auVar2 = _DAT_0012aa40;
  pdVar8 = vVar23.v;
  uVar3 = vVar23.x;
  pdVar9 = pdVar8;
  if (0 < w2) {
    dVar18 = nyquist / (double)w2;
    lVar14 = (ulong)(uint)w2 - 1;
    auVar20._8_4_ = (int)lVar14;
    auVar20._0_8_ = lVar14;
    auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar10 = 0;
    auVar20 = auVar20 ^ _DAT_0012aa40;
    auVar21 = _DAT_0012aa30;
    do {
      auVar22 = auVar21 ^ auVar2;
      if ((bool)(~(auVar22._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar22._0_4_ ||
                  auVar20._4_4_ < auVar22._4_4_) & 1)) {
        pdVar8[uVar10] = (double)(int)uVar10 * dVar18;
      }
      uVar1 = -(ushort)(auVar22._12_4_ == auVar20._12_4_ && auVar20._8_4_ < auVar22._8_4_ ||
                       auVar20._12_4_ < auVar22._12_4_) ^ 0xffff;
      pdVar9 = (double *)(ulong)uVar1;
      if ((uVar1 & 1) != 0) {
        pdVar8[uVar10 + 1] = (double)((int)uVar10 + 1) * dVar18;
        pdVar9 = pdVar8;
      }
      uVar10 = uVar10 + 2;
      lVar14 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar14 + 2;
    } while ((w2 + 1U & 0xfffffffe) != uVar10);
  }
  vVar23.v = pdVar9;
  vVar23._0_8_ = pdVar8;
  iVar4 = bisectv((swipe *)(ulong)uVar3,vVar23,*local_140);
  local_118 = CONCAT44(extraout_var,iVar4);
  dVar18 = ceil((double)local_144 / (double)w2);
  L = makem((int)(dVar18 + 1.0),fERBs.x);
  if (w2 < 1) {
    uVar5 = 0;
  }
  else {
    memset(fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start,0,(ulong)(uint)w2 << 3);
    uVar5 = w2;
  }
  if ((int)uVar5 < w) {
    uVar10 = (ulong)uVar5;
    do {
      fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] = local_138[uVar10 - (long)w2] * pdVar7[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
  }
  f._4_4_ = 0;
  f.x = uVar3;
  f.v = pdVar8;
  fERBs_00.v = local_140;
  fERBs_00._0_8_ = uVar13;
  La(L,f,fERBs_00,&plan,&fi,&fo,&buffer,w2,(int)local_118,0);
  local_120 = (ulong)(uint)w2;
  if (L.x < 4) {
    iVar4 = 1;
    lVar14 = 0;
    pdVar9 = extraout_RDX;
    local_150 = L._0_8_;
  }
  else {
    local_130 = CONCAT44(local_130._4_4_,L.x + -3);
    lVar14 = 0;
    pdVar9 = local_138;
    local_128 = (long)w2;
    i = 1;
    do {
      local_170 = L.m;
      local_150 = L._0_8_;
      if (0 < w) {
        uVar10 = 0;
        do {
          fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10] = pdVar9[uVar10] * pdVar7[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      f_00._4_4_ = 0;
      f_00.x = uVar3;
      f_00.v = pdVar8;
      fERBs_01.v = local_140;
      fERBs_01._0_8_ = uVar13;
      La(L,f_00,fERBs_01,&plan,&fi,&fo,&buffer,(int)local_120,(int)local_118,i);
      L.m = local_170;
      L.x = (undefined4)local_150;
      L.y = local_150._4_4_;
      lVar14 = lVar14 + local_128;
      iVar4 = i + 1;
      pdVar9 = pdVar9 + w2;
      bVar17 = i != (int)local_130;
      i = iVar4;
    } while (bVar17);
    lVar14 = (long)(int)lVar14;
    pdVar9 = extraout_RDX_00;
  }
  uVar12 = local_150;
  local_170 = L.m;
  if (iVar4 < L.x) {
    lVar15 = (long)(int)local_120;
    local_128 = (long)local_144;
    pdVar11 = local_138 + lVar14;
    local_130 = lVar15 * 8;
    do {
      uVar10 = 0;
      if (lVar14 < local_128) {
        uVar10 = 0;
        do {
          fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10] = pdVar11[uVar10] * pdVar7[uVar10];
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < local_128 - lVar14);
      }
      if ((int)(uint)uVar10 < w) {
        memset(fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar10 & 0xffffffff),0,
               (ulong)(~(uint)uVar10 + w) * 8 + 8);
      }
      uVar10 = local_150;
      f_01._4_4_ = 0;
      f_01.x = uVar3;
      L_00.m = local_170;
      local_150._0_4_ = (undefined4)uVar12;
      local_150._4_4_ = SUB84(uVar12,4);
      L_00.x = (undefined4)local_150;
      L_00.y = local_150._4_4_;
      f_01.v = pdVar8;
      fERBs_02.v = local_140;
      fERBs_02._0_8_ = uVar13;
      local_150 = uVar10;
      La(L_00,f_01,fERBs_02,&plan,&fi,&fo,&buffer,(int)local_120,(int)local_118,iVar4);
      lVar14 = lVar14 + lVar15;
      iVar4 = iVar4 + 1;
      pdVar11 = (double *)((long)pdVar11 + local_130);
      pdVar9 = extraout_RDX_01;
    } while (iVar4 != (int)uVar12);
  }
  yr_vector.v = pdVar9;
  yr_vector._0_8_ = pdVar7;
  freev((swipe *)(ulong)local_10c,yr_vector);
  uVar12 = local_150;
  yr_vector_00.v = extraout_RDX_02;
  yr_vector_00._0_8_ = pdVar8;
  freev((swipe *)(ulong)uVar3,yr_vector_00);
  uVar10 = local_150;
  if (0 < (int)uVar12) {
    uVar12 = local_150 >> 0x20;
    uVar3 = (uint)local_150;
    uVar16 = 0;
    do {
      dVar19 = 0.0;
      iVar4 = (int)(uVar10 >> 0x20);
      dVar18 = 0.0;
      if (0 < iVar4) {
        uVar6 = 0;
        do {
          dVar19 = dVar19 + local_170[uVar16][uVar6] * local_170[uVar16][uVar6];
          uVar6 = uVar6 + 1;
          dVar18 = dVar19;
        } while (uVar12 != uVar6);
      }
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        if (dVar18 < 0.0) {
          dVar18 = sqrt(dVar18);
        }
        else {
          dVar18 = SQRT(dVar18);
        }
        if (iVar4 != 0 && -1 < (long)uVar10) {
          pdVar7 = local_170[uVar16];
          uVar6 = 0;
          do {
            pdVar7[uVar6] = pdVar7[uVar6] / dVar18;
            uVar6 = uVar6 + 1;
          } while (uVar12 != uVar6);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uVar3 & 0x7fffffff));
  }
  RealValuedFastFourierTransform::Buffer::~Buffer(&buffer);
  RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&plan);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&fo);
  if (fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  mVar24.m = local_170;
  mVar24.x = (undefined4)local_150;
  mVar24.y = local_150._4_4_;
  return mVar24;
}

Assistant:

matrix loudness(vector x, vector fERBs, double nyquist, int w, int w2) {
    int i, j, hi; 
    int offset = 0;
    double td = nyquist / w2; // this is equivalent to fstep
    // testing showed this configuration of fftw to be fastest
#if 0
    double* fi = fftw_malloc(sizeof(double) * w); 
    fftw_complex* fo = fftw_malloc(sizeof(fftw_complex) * w);
    fftw_plan plan = fftw_plan_dft_r2c_1d(w, fi, fo, FFTW_ESTIMATE); 
#else
    std::vector<double> fi(w); 
    std::vector<std::vector<double> > fo(2, std::vector<double>(w));
    sptk::RealValuedFastFourierTransform plan(w2 * 2 - 1, w2 * 2);
    sptk::RealValuedFastFourierTransform::Buffer buffer;
#endif
    vector hann = makev(w); // this defines the Hann[ing] window
    for (i = 0; i < w; i++) 
        hann.v[i] = .5 - (.5 * cos(2. * M_PI * ((double) i / w)));
    vector f = makev(w2);
    for (i = 0; i < w2; i++) 
        f.v[i] = i * td;
    hi = bisectv(f, fERBs.v[0]); // all calls to La() will begin here
    matrix L = makem(ceil((double) x.x / w2) + 1, fERBs.x); 
    for (j = 0; j < w2; j++) // left boundary case
        fi[j] = 0.; // more explicitly, 0. * hann.v[j]
    for (/* j = w2 */; j < w; j++) 
        fi[j] = x.v[j - w2] * hann.v[j];
#if 0
    La(L, f, fERBs, plan, fo, w2, hi, 0); 
#else
    La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, 0); 
#endif
    for (i = 1; i < L.x - 2; i++) { 
        for (j = 0; j < w; j++) 
            fi[j] = x.v[j + offset] * hann.v[j];
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i); 
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i); 
#endif
        offset += w2;
    }
    for (/* i = L.x - 2; */; i < L.x; i++) { // right two boundary cases
        for (j = 0; j < x.x - offset; j++) // this dies at x.x + w2
            fi[j] = x.v[j + offset] * hann.v[j];
        for (/* j = x.x - offset */; j < w; j++) 
            fi[j] = 0.; // once again, 0. * hann.v[j] 
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i);
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i);
#endif
        offset += w2;
    } // now L is fully valued
    freev(hann);
    freev(f);
    // L must now be normalized
    for (i = 0; i < L.x; i++) { 
        td = 0.; // td is the value of the normalization factor
        for (j = 0; j < L.y; j++) 
            td += L.m[i][j] * L.m[i][j];
        if (td != 0.) { // catches zero-division
            td = sqrt(td);
            for (j = 0; j < L.y; j++) 
                L.m[i][j] /= td;
        } // otherwise, it is already 0.
    } 
#if 0
    fftw_destroy_plan(plan); 
    fftw_free(fi); 
    fftw_free(fo); 
#endif
    return(L);
}